

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate-solution.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  Solution solution;
  Problem problem;
  Parameters parameters;
  ProblemGraph problemGraph;
  Solution local_160;
  Problem local_148;
  Parameters local_100;
  ProblemGraph local_a0;
  
  parseCommandLine(&local_100,argc,argv);
  local_148.node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.nodes.super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.nodes.super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.nodes.super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lineage::loadNodes(&local_100.nodesFileName,&local_148);
  lineage::loadEdges(&local_100.edgesFileName,&local_148);
  lineage::loadSolution(&local_160,&local_100.fragmentEdgeLabelsFileName);
  lineage::ProblemGraph::ProblemGraph(&local_a0,&local_148);
  lineage::validate(&local_a0,&local_160);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_a0.nodeIndicesInFrame_);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_a0.edgeIndicesInFrame_);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_a0.edgeIndicesFromFrame_);
  if (local_a0.graph_.edges_.
      super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.graph_.edges_.
                    super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.graph_.edges_.
                          super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.graph_.edges_.
                          super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
  ::~vector(&local_a0.graph_.vertices_);
  if (local_160.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.edge_labels.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_160.edge_labels.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.edge_labels.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148.node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.node_offsets.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.node_offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.node_offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.edges.
                    super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.edges.
                          super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.edges.
                          super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148.nodes.super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.nodes.
                    super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.nodes.
                          super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.nodes.
                          super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.fragmentEdgeLabelsFileName._M_dataplus._M_p !=
      &local_100.fragmentEdgeLabelsFileName.field_2) {
    operator_delete(local_100.fragmentEdgeLabelsFileName._M_dataplus._M_p,
                    local_100.fragmentEdgeLabelsFileName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.nodesFileName._M_dataplus._M_p != &local_100.nodesFileName.field_2) {
    operator_delete(local_100.nodesFileName._M_dataplus._M_p,
                    local_100.nodesFileName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.edgesFileName._M_dataplus._M_p != &local_100.edgesFileName.field_2) {
    operator_delete(local_100.edgesFileName._M_dataplus._M_p,
                    local_100.edgesFileName.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
try
{
    auto parameters = parseCommandLine(argc, argv);
    auto problem = lineage::loadProblem(parameters.nodesFileName, parameters.edgesFileName);
    auto solution = lineage::loadSolution(parameters.fragmentEdgeLabelsFileName);

    lineage::ProblemGraph problemGraph(problem);
    lineage::validate(problemGraph, solution);

    return 0;
}
catch (const runtime_error& error)
{
    cerr << "error: " << error.what() << endl;
    return 1;
}